

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Value * __thiscall toml::Value::push(Value *this,Value *v)

{
  Value local_38;
  vector<toml::Value,_std::allocator<toml::Value>_> local_28;
  
  if (this->type_ != ARRAY_TYPE) {
    if (this->type_ != NULL_TYPE) {
      failwith<char_const(&)[38]>((char (*) [38])"type must be array to do push(Value).");
    }
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.type_ = ARRAY_TYPE;
    local_38.field_1.null_ = operator_new(0x18);
    ((local_38.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38.field_1.string_)->_M_string_length = 0;
    ((local_38.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (&local_38 != this) {
      ~Value(this);
      this->type_ = local_38.type_;
      switch(local_38.type_) {
      case NULL_TYPE:
      case INT_TYPE:
      case STRING_TYPE:
      case TIME_TYPE:
      case ARRAY_TYPE:
      case TABLE_TYPE:
        (this->field_1).array_ = (Array *)local_38.field_1;
        break;
      case BOOL_TYPE:
        (this->field_1).bool_ = local_38.field_1.bool_;
        break;
      case DOUBLE_TYPE:
        (this->field_1).array_ = (Array *)local_38.field_1;
        break;
      default:
        this->type_ = NULL_TYPE;
        (this->field_1).null_ = (void *)0x0;
      }
      local_38.type_ = NULL_TYPE;
      local_38.field_1.null_ = (Array *)0x0;
    }
    ~Value(&local_38);
    std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(&local_28);
  }
  std::vector<toml::Value,_std::allocator<toml::Value>_>::emplace_back<toml::Value>
            ((vector<toml::Value,_std::allocator<toml::Value>_> *)(this->field_1).string_,v);
  return (Value *)(((this->field_1).string_)->_M_string_length - 0x10);
}

Assistant:

inline Value* Value::push(Value&& v)
{
    if (!valid())
        *this = Value((Array()));
    else if (!is<Array>())
        failwith("type must be array to do push(Value).");

    array_->push_back(std::move(v));
    return &array_->back();
}